

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O3

deUint32 glu::chooseDepthStencilFormat(RenderConfig *config)

{
  deUint32 internalFormat;
  int iVar1;
  int iVar2;
  TextureFormat in_RAX;
  long lVar3;
  TextureFormat combinedFormat;
  TextureFormat local_38;
  
  lVar3 = 0;
  local_38 = in_RAX;
  do {
    internalFormat = *(deUint32 *)((long)chooseDepthStencilFormat::s_formats + lVar3);
    local_38 = mapGLInternalFormat(internalFormat);
    iVar1 = getNumDepthBits(&local_38);
    iVar2 = getNumStencilBits(&local_38);
    if ((config->depthBits == -1) || (config->depthBits == iVar1)) {
      if (config->stencilBits == -1) {
        return internalFormat;
      }
      if (config->stencilBits == iVar2) {
        return internalFormat;
      }
    }
    lVar3 = lVar3 + 4;
    if (lVar3 == 0x18) {
      return 0;
    }
  } while( true );
}

Assistant:

deUint32 chooseDepthStencilFormat (const glu::RenderConfig& config)
{
	static const deUint32 s_formats[] =
	{
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_STENCIL_INDEX8
	};

	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(s_formats); fmtNdx++)
	{
		const deUint32				format			= s_formats[fmtNdx];
		const tcu::TextureFormat	combinedFormat	= glu::mapGLInternalFormat(format);
		const int					depthBits		= getNumDepthBits(combinedFormat);
		const int					stencilBits		= getNumStencilBits(combinedFormat);

		if (config.depthBits != glu::RenderConfig::DONT_CARE &&
			config.depthBits != depthBits)
			continue;

		if (config.stencilBits != glu::RenderConfig::DONT_CARE &&
			config.stencilBits != stencilBits)
			continue;

		return format;
	}

	return 0;
}